

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O1

bool __thiscall irr::scene::CSkinnedMesh::useAnimationFrom(CSkinnedMesh *this,ISkinnedMesh *mesh)

{
  SJoint *__lhs;
  SJoint *__rhs;
  __optional_eq_t<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> _Var1;
  int iVar2;
  pointer ppSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  
  ppSVar3 = (this->AllJoints).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(this->AllJoints).m_data.
             super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 & 0x7fffffff8U) == 0) {
    bVar6 = true;
  }
  else {
    uVar7 = 0;
    bVar5 = 0;
    do {
      __lhs = ppSVar3[uVar7];
      __lhs->UseAnimationFrom = (SJoint *)0x0;
      if ((__lhs->Name).
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        iVar2 = ::std::__cxx11::string::compare((char *)__lhs);
        if (iVar2 != 0) goto LAB_001a3b26;
        bVar5 = 1;
      }
      else {
LAB_001a3b26:
        iVar2 = (*(mesh->super_IAnimatedMesh).super_IMesh._vptr_IMesh[0x1c])(mesh);
        if ((((long *)CONCAT44(extraout_var,iVar2))[1] - *(long *)CONCAT44(extraout_var,iVar2) &
            0x7fffffff8U) != 0) {
          uVar4 = 0;
          do {
            iVar2 = (*(mesh->super_IAnimatedMesh).super_IMesh._vptr_IMesh[0x1c])(mesh);
            __rhs = *(SJoint **)(*(long *)CONCAT44(extraout_var_00,iVar2) + uVar4 * 8);
            _Var1 = ::std::operator==(&__lhs->Name,&__rhs->Name);
            if (_Var1) {
              __lhs->UseAnimationFrom = __rhs;
            }
            uVar4 = uVar4 + 1;
            iVar2 = (*(mesh->super_IAnimatedMesh).super_IMesh._vptr_IMesh[0x1c])(mesh);
          } while (uVar4 < ((ulong)(((long *)CONCAT44(extraout_var_01,iVar2))[1] -
                                   *(long *)CONCAT44(extraout_var_01,iVar2)) >> 3 & 0xffffffff));
        }
        if (__lhs->UseAnimationFrom == (SJoint *)0x0) {
          bVar5 = 1;
        }
      }
      uVar7 = uVar7 + 1;
      ppSVar3 = (this->AllJoints).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < ((ulong)((long)(this->AllJoints).m_data.
                                    super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3) >> 3
                     & 0xffffffff));
    bVar6 = (bool)(bVar5 ^ 1);
  }
  checkForAnimation(this);
  return bVar6;
}

Assistant:

bool CSkinnedMesh::useAnimationFrom(const ISkinnedMesh *mesh)
{
	bool unmatched = false;

	for (u32 i = 0; i < AllJoints.size(); ++i) {
		SJoint *joint = AllJoints[i];
		joint->UseAnimationFrom = 0;

		if (joint->Name == "")
			unmatched = true;
		else {
			for (u32 j = 0; j < mesh->getAllJoints().size(); ++j) {
				SJoint *otherJoint = mesh->getAllJoints()[j];
				if (joint->Name == otherJoint->Name) {
					joint->UseAnimationFrom = otherJoint;
				}
			}
			if (!joint->UseAnimationFrom)
				unmatched = true;
		}
	}

	checkForAnimation();

	return !unmatched;
}